

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::InsideExpression::serializeTo(InsideExpression *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  if ((this->rangeList_)._M_extent._M_extent_value != 0) {
    name._M_str = "rangeList";
    name._M_len = 9;
    ASTSerializer::startArray(serializer,name);
    sVar1 = (this->rangeList_)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      ppEVar2 = (this->rangeList_)._M_ptr;
      lVar3 = 0;
      do {
        ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
        lVar3 = lVar3 + 8;
      } while (sVar1 << 3 != lVar3);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void InsideExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());

    if (!rangeList().empty()) {
        serializer.startArray("rangeList");
        for (auto elem : rangeList())
            serializer.serialize(*elem);
        serializer.endArray();
    }
}